

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_vnum(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  char *string;
  char arg [4608];
  char *in_stack_ffffffffffffedd8;
  char *in_stack_ffffffffffffede0;
  char in_stack_ffffffffffffede8;
  uint7 in_stack_ffffffffffffede9;
  char *in_stack_ffffffffffffedf0;
  
  one_argument(in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
  if (in_stack_ffffffffffffede8 == '\0') {
    send_to_char(in_stack_ffffffffffffedf0,(CHAR_DATA *)((ulong)in_stack_ffffffffffffede9 << 8));
    send_to_char(in_stack_ffffffffffffedf0,
                 (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8));
    send_to_char(in_stack_ffffffffffffedf0,
                 (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8));
    send_to_char(in_stack_ffffffffffffedf0,
                 (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8));
  }
  else {
    bVar1 = str_cmp(&stack0xffffffffffffede8,"obj");
    if (bVar1) {
      bVar1 = str_cmp(&stack0xffffffffffffede8,"mob");
      if ((bVar1) && (bVar1 = str_cmp(&stack0xffffffffffffede8,"char"), bVar1)) {
        bVar1 = str_cmp(&stack0xffffffffffffede8,"skill");
        if ((bVar1) && (bVar1 = str_cmp(&stack0xffffffffffffede8,"spell"), bVar1)) {
          do_mfind((CHAR_DATA *)arg._4592_8_,(char *)arg._4584_8_);
          do_ofind((CHAR_DATA *)arg._4592_8_,(char *)arg._4584_8_);
        }
        else {
          do_slookup((CHAR_DATA *)arg._4576_8_,(char *)arg._4568_8_);
        }
      }
      else {
        do_mfind((CHAR_DATA *)arg._4592_8_,(char *)arg._4584_8_);
      }
    }
    else {
      do_ofind((CHAR_DATA *)arg._4592_8_,(char *)arg._4584_8_);
    }
  }
  return;
}

Assistant:

void do_vnum(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	char *string;

	string = one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Syntax:\n\r", ch);
		send_to_char("  vnum obj <name>\n\r", ch);
		send_to_char("  vnum mob <name>\n\r", ch);
		send_to_char("  vnum skill <skill or spell>\n\r", ch);
		return;
	}

	if (!str_cmp(arg, "obj"))
	{
		do_ofind(ch, string);
		return;
	}

	if (!str_cmp(arg, "mob") || !str_cmp(arg, "char"))
	{
		do_mfind(ch, string);
		return;
	}

	if (!str_cmp(arg, "skill") || !str_cmp(arg, "spell"))
	{
		do_slookup(ch, string);
		return;
	}

	/* do both */
	do_mfind(ch, argument);
	do_ofind(ch, argument);
}